

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPrintMint(Abc_Frame_t *pAbc,int argc,char **argv)

{
  DdManager *manager;
  DdNode *node;
  bool bVar1;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pObj_00;
  char *pcVar4;
  uint local_3c;
  int fVerbose;
  int c;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar2 = Extra_UtilGetopt(argc,argv,"svwh");
    if (iVar2 == -1) {
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        iVar2 = Abc_NtkIsStrash(pNtk_00);
        if (iVar2 == 0) {
          iVar2 = Abc_NtkHasBdd(pNtk_00);
          if (iVar2 == 0) {
            Abc_Print(-1,
                      "This command works only for logic networks with local functions represented by BDDs.\n"
                     );
            pAbc_local._4_4_ = 1;
          }
          else {
            for (local_3c = 0; iVar2 = Vec_PtrSize(pNtk_00->vObjs), (int)local_3c < iVar2;
                local_3c = local_3c + 1) {
              pObj_00 = Abc_NtkObj(pNtk_00,local_3c);
              if ((pObj_00 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pObj_00), iVar2 != 0)) {
                uVar3 = Abc_ObjFaninNum(pObj_00);
                manager = (DdManager *)pNtk_00->pManFunc;
                node = (DdNode *)(pObj_00->field_5).pData;
                iVar2 = Abc_ObjFaninNum(pObj_00);
                Cudd_CountMinterm(manager,node,iVar2);
                printf("ObjId %3d : SuppSize = %5d   MintCount = %32.0f\n",(ulong)local_3c,
                       (ulong)uVar3);
              }
            }
            pAbc_local._4_4_ = 0;
          }
        }
        else {
          Abc_Print(-1,"This command works only for logic networks (run \"clp\").\n");
          pAbc_local._4_4_ = 1;
        }
      }
      return pAbc_local._4_4_;
    }
    if ((iVar2 == 0x68) || (iVar2 != 0x76)) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  Abc_Print(-2,"usage: print_mint [-svwh]\n");
  Abc_Print(-2,"\t        prints the number of on-set minterms in the PO functions\n");
  pcVar4 = "no";
  if (bVar1) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-v    : enable verbose output [default = %s].\n",pcVar4);
  Abc_Print(-2,"\t-h    : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandPrintMint( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pObj;
    int c;
    int fVerbose;

    // set defaults
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "svwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for logic networks (run \"clp\").\n" );
        return 1;
    }
    if ( !Abc_NtkHasBdd(pNtk) )
    {
        Abc_Print( -1, "This command works only for logic networks with local functions represented by BDDs.\n" );
        return 1;
    }
    Abc_NtkForEachNode( pNtk, pObj, c )
        printf( "ObjId %3d : SuppSize = %5d   MintCount = %32.0f\n", c, Abc_ObjFaninNum(pObj), 
            Cudd_CountMinterm((DdManager *)pNtk->pManFunc, (DdNode *)pObj->pData, Abc_ObjFaninNum(pObj)) );
    return 0;

usage:
    Abc_Print( -2, "usage: print_mint [-svwh]\n" );
    Abc_Print( -2, "\t        prints the number of on-set minterms in the PO functions\n" );
    Abc_Print( -2, "\t-v    : enable verbose output [default = %s].\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}